

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::TuplePrefixPrinter<3ul>::PrintPrefixTo<std::tuple<int,int,char_const*>>
               (tuple<int,_int,_const_char_*> *t,ostream *os)

{
  TuplePrefixPrinter<2ul>::PrintPrefixTo<std::tuple<int,int,char_const*>>(t,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  PrintTo((t->super__Tuple_impl<0UL,_int,_int,_const_char_*>).
          super__Tuple_impl<1UL,_int,_const_char_*>.super__Tuple_impl<2UL,_const_char_*>.
          super__Head_base<2UL,_const_char_*,_false>._M_head_impl,os);
  return;
}

Assistant:

static void PrintPrefixTo(const Tuple& t, ::std::ostream* os) {
    TuplePrefixPrinter<N - 1>::PrintPrefixTo(t, os);
    GTEST_INTENTIONAL_CONST_COND_PUSH_()
    if (N > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
      *os << ", ";
    }
    UniversalPrinter<
        typename TuplePolicy<Tuple>::template tuple_element<N - 1>::type>
        ::Print(TuplePolicy<Tuple>::template get<N - 1>(t), os);
  }